

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.hpp
# Opt level: O1

void __thiscall
boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::
~queue(queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_> *this)

{
  tagged_index tVar1;
  bool bVar2;
  uint uVar3;
  Task *dummy;
  Task *pTStack_18;
  
  do {
    bVar2 = queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::
            unsynchronized_pop<depspawn::internal::TaskPool::Task*>(this,&pTStack_18);
  } while (bVar2);
  uVar3 = (uint)(this->head_)._M_i & 0xffff;
  tVar1 = (this->pool).pool_._M_i;
  *(index_t *)
   ((long)&(((this->pool).
             super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
            .nodes_)->next)._M_i.index + (ulong)(uVar3 << 6)) = tVar1.index;
  LOCK();
  (this->pool).pool_._M_i = (tagged_index)((uint)tVar1 & 0xffff0000 | uVar3);
  UNLOCK();
  operator_delete(*(void **)&(this->pool).
                             super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                             .nodes_[-1].field_0x38);
  return;
}

Assistant:

~queue(void)
    {
        T dummy;
        while(unsynchronized_pop(dummy))
        {}

        pool.template destruct<false>(head_.load(memory_order_relaxed));
    }